

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

_Bool consume(ch_compilation *comp,ch_token_kind kind,char *error_message,ch_token *out_token)

{
  ch_token *next;
  char *pcVar1;
  uint32_t uVar2;
  undefined4 uVar3;
  ch_token_kind cVar4;
  undefined4 uVar5;
  _Bool _Var6;
  
  if ((comp->is_panic == false) && ((comp->current).kind == kind)) {
    next = &comp->current;
    cVar4 = next->kind;
    uVar5 = *(undefined4 *)&next->field_0x4;
    pcVar1 = (comp->current).lexeme.start;
    uVar2 = (comp->current).line;
    uVar3 = *(undefined4 *)&(comp->current).field_0x1c;
    (comp->previous).lexeme.size = (comp->current).lexeme.size;
    (comp->previous).line = uVar2;
    *(undefined4 *)&(comp->previous).field_0x1c = uVar3;
    (comp->previous).kind = cVar4;
    *(undefined4 *)&(comp->previous).field_0x4 = uVar5;
    (comp->previous).lexeme.start = pcVar1;
    do {
      _Var6 = ch_token_next(&comp->token_state,next);
    } while (!_Var6);
    _Var6 = true;
    if (out_token != (ch_token *)0x0) {
      cVar4 = (comp->previous).kind;
      uVar5 = *(undefined4 *)&(comp->previous).field_0x4;
      pcVar1 = (comp->previous).lexeme.start;
      uVar2 = (comp->previous).line;
      uVar3 = *(undefined4 *)&(comp->previous).field_0x1c;
      (out_token->lexeme).size = (comp->previous).lexeme.size;
      out_token->line = uVar2;
      *(undefined4 *)&out_token->field_0x1c = uVar3;
      out_token->kind = cVar4;
      *(undefined4 *)&out_token->field_0x4 = uVar5;
      (out_token->lexeme).start = pcVar1;
    }
  }
  else {
    _Var6 = false;
    error(comp,error_message);
  }
  return _Var6;
}

Assistant:

bool consume(ch_compilation *comp, ch_token_kind kind,
             const char *error_message, ch_token *out_token) {
    bool result = opt_consume(comp, kind, out_token);
    if (!result) {
      error(comp, error_message);
    }

    return result;
}